

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.hpp
# Opt level: O2

void __thiscall spirv_cross::CompilerCPP::~CompilerCPP(CompilerCPP *this)

{
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerCPP_00464618;
  ::std::__cxx11::string::~string((string *)&this->interface_name);
  ::std::__cxx11::string::~string((string *)&this->resource_type);
  ::std::__cxx11::string::~string((string *)&this->impl_type);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&this->resource_registrations);
  CompilerGLSL::~CompilerGLSL(&this->super_CompilerGLSL);
  return;
}

Assistant:

explicit CompilerCPP(std::vector<uint32_t> spirv_)
	    : CompilerGLSL(std::move(spirv_))
	{
	}